

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_context_restore(uc_engine *uc,uc_context *context)

{
  uc_err uVar1;
  uc_err ret;
  int __init_ret;
  uc_context *context_local;
  uc_engine *uc_local;
  
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    if ((uc->context_content & UC_CTL_CONTEXT_MEMORY) != 0) {
      uc->snapshot_level = context->snapshot_level;
      uVar1 = uc_restore_latest_snapshot(uc);
      if (uVar1 != UC_ERR_OK) {
        return uVar1;
      }
      uc_snapshot(uc);
    }
    if ((uc->context_content & UC_CTL_CONTEXT_CPU) == 0) {
      uc_local._4_4_ = UC_ERR_OK;
    }
    else if (uc->context_restore == (uc_context_restore_t)0x0) {
      memcpy(uc->cpu->env_ptr,&context->field_0x14,context->context_size);
      uc_local._4_4_ = UC_ERR_OK;
    }
    else {
      uc_local._4_4_ = (*uc->context_restore)(uc,context);
    }
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_context_restore(uc_engine *uc, uc_context *context)
{
    UC_INIT(uc);
    uc_err ret;

    if (uc->context_content & UC_CTL_CONTEXT_MEMORY) {
        uc->snapshot_level = context->snapshot_level;
        ret = uc_restore_latest_snapshot(uc);
        if (ret != UC_ERR_OK) {
            return ret;
        }
        uc_snapshot(uc);
    }

    if (uc->context_content & UC_CTL_CONTEXT_CPU) {
        if (!uc->context_restore) {
            memcpy(uc->cpu->env_ptr, context->data, context->context_size);
            return UC_ERR_OK;
        } else {
            return uc->context_restore(uc, context);
        }
    }
    return UC_ERR_OK;
}